

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O3

void __thiscall
ORPG::NameGenerator::NameGenerator(NameGenerator *this,string *_race,string *_gender)

{
  pointer pcVar1;
  
  ORPG::Core::DATA_LOCATION_abi_cxx11_();
  (this->race)._M_dataplus._M_p = (pointer)&(this->race).field_2;
  pcVar1 = (_race->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->race,pcVar1,pcVar1 + _race->_M_string_length);
  (this->raceFile)._M_dataplus._M_p = (pointer)&(this->raceFile).field_2;
  pcVar1 = (_race->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->raceFile,pcVar1,pcVar1 + _race->_M_string_length);
  (this->gender)._M_dataplus._M_p = (pointer)&(this->gender).field_2;
  pcVar1 = (_gender->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->gender,pcVar1,pcVar1 + _gender->_M_string_length);
  std::__cxx11::string::append((char *)this);
  Initialize(this);
  return;
}

Assistant:

NameGenerator::NameGenerator(string _race, string _gender)
        :location(Core::DATA_LOCATION()), race(_race), raceFile(_race), gender(_gender) {
        location += "/names";

        Initialize();
    }